

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

Vector3D * __thiscall CS248::Application::getMouseProjection(Application *this,double dist)

{
  undefined8 uVar1;
  bool bVar2;
  long in_RSI;
  Vector3D *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  float fVar4;
  undefined1 auVar5 [16];
  double t;
  Vector3D rayOrig;
  Vector3D rayWor;
  Vector4D rayWor4;
  Vector4D rayEye;
  Vector4D rayClip;
  double y;
  double x;
  Matrix4x4 modelviewMatrix;
  GLdouble modelview [16];
  Matrix4x4 projectionMatrix;
  GLdouble projection [16];
  Vector3D *intersect;
  Matrix4x4 *in_stack_00000558;
  float fVar6;
  Vector3D *this_00;
  Vector3D *this_01;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  Vector3D local_358;
  double local_340;
  Vector3D local_338;
  Vector3D local_320;
  double local_308;
  double local_300;
  double local_2f8;
  Vector4D *in_stack_fffffffffffffd30;
  Matrix4x4 *in_stack_fffffffffffffd38;
  Vector4D local_248;
  double local_228;
  double local_220;
  Vector3D local_198 [16];
  double local_18;
  
  this_00 = in_RDI;
  local_18 = in_XMM0_Qa;
  glGetDoublev(0xba7);
  Matrix4x4::Matrix4x4
            ((Matrix4x4 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             (double *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  this_01 = local_198;
  glGetDoublev(0xba6);
  Matrix4x4::Matrix4x4
            ((Matrix4x4 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             (double *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_220 = (double)((*(float *)(in_RSI + 0x1fc) + *(float *)(in_RSI + 0x1fc)) /
                       (float)*(ulong *)(in_RSI + 0x1d8) + -1.0);
  fVar4 = (float)(long)*(ulong *)(in_RSI + 0x1e0);
  fVar6 = (float)*(ulong *)(in_RSI + 0x1e0);
  dVar3 = (double)(fVar6 - *(float *)(in_RSI + 0x200));
  uVar1 = *(undefined8 *)(in_RSI + 0x1e0);
  auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  local_228 = (dVar3 + dVar3) /
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - 1.0;
  Vector4D::Vector4D(&local_248,local_220,local_228,-1.0,1.0);
  Matrix4x4::inv(in_stack_00000558);
  Matrix4x4::operator*(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  Matrix4x4::operator*(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  Vector3D::Vector3D(&local_320,local_308,local_300,local_2f8);
  Camera::getPosition((Camera *)CONCAT44(fVar6,fVar4));
  Vector3D::operator-((Vector3D *)CONCAT44(fVar6,fVar4));
  local_340 = dot(&local_338,&local_358);
  bVar2 = std::isfinite(local_18);
  if (bVar2) {
    Vector3D::unit(this_01);
    local_340 = local_18;
  }
  CS248::operator*(&this_00->x,in_RDI);
  Vector3D::operator+(this_00,in_RDI);
  return this_00;
}

Assistant:

Vector3D Application::getMouseProjection(double dist) {
  // get projection matrix from OpenGL stack.
  GLdouble projection[16];
  glGetDoublev(GL_PROJECTION_MATRIX, projection);
  Matrix4x4 projectionMatrix(projection);

  // get view matrix from OpenGL stack.
  GLdouble modelview[16];
  glGetDoublev(GL_MODELVIEW_MATRIX, modelview);
  Matrix4x4 modelviewMatrix(modelview);

  // ray in clip coordinates
  double x = mouseX * 2 / screenW - 1;
  double y = screenH - mouseY;  // y is upside down
  y = y * 2 / screenH - 1;
  Vector4D rayClip(x, y, -1.0, 1.0);
  // ray in eye coordinates
  Vector4D rayEye = projectionMatrix.inv() * rayClip;

  // ray is into the screen and not a point.
  rayEye.z = -1.0;
  rayEye.w = 0.0;

  // ray in world coordinates
  Vector4D rayWor4 = modelviewMatrix * rayEye;
  Vector3D rayWor(rayWor4.x, rayWor4.y, rayWor4.z);

  Vector3D rayOrig(camera.getPosition());

  double t = dot(rayOrig, -rayWor);
  if (std::isfinite(dist)) {
    // If a distance was given, use that instead
    rayWor = rayWor.unit();
    t = dist;
  }

  Vector3D intersect = rayOrig + t * rayWor;

  return intersect;
}